

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantizeData::initial_blob_max(QuantizeData *this,Mat *data)

{
  float *pfVar1;
  long in_RSI;
  long in_RDI;
  double dVar2;
  int i;
  float *data_n;
  int q;
  int size;
  int channel_num;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff68;
  float local_7c;
  int local_78;
  Mat local_68;
  Mat *local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RSI + 0x34);
  local_18 = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x30);
  for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
    this_00 = &local_68;
    ncnn::Mat::channel(in_stack_ffffffffffffff68,(int)((ulong)this_00 >> 0x20));
    in_stack_ffffffffffffff68 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
    ncnn::Mat::~Mat((Mat *)0x114976);
    local_28 = in_stack_ffffffffffffff68;
    for (local_78 = 0; local_78 < local_18; local_78 = local_78 + 1) {
      dVar2 = std::fabs((double)(ulong)(uint)*(float *)((long)&local_28->data + (long)local_78 * 4))
      ;
      local_7c = SUB84(dVar2,0);
      pfVar1 = std::max<float>((float *)(in_RDI + 0x20),&local_7c);
      *(float *)(in_RDI + 0x20) = *pfVar1;
    }
  }
  return 0;
}

Assistant:

int QuantizeData::initial_blob_max(ncnn::Mat data)
{
    int channel_num = data.c;
    int size = data.w * data.h;

    for (int q=0; q<channel_num; q++)
    {
        const float *data_n = data.channel(q);
        for(int i=0; i<size; i++)
        {
            max_value = std::max(max_value, std::fabs(data_n[i]));
        }
    }

    return 0;
}